

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_insert_iterator_range_Test::TestBody
          (VectorSUnitTest_insert_iterator_range_Test *this)

{
  uint *last;
  uint *lhs;
  uint *lhs_00;
  char *pcVar1;
  iterator it3;
  iterator it2;
  iterator it1;
  array<unsigned_int,_3UL> src;
  vector_s<unsigned_int,_12UL> v;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  AssertHelper local_88;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  undefined4 local_70;
  uint local_68 [4];
  vector_s<unsigned_int,_12UL> local_58;
  
  local_68[0] = 10;
  local_68[1] = 0x14;
  local_68[2] = 0x1e;
  local_a8 = (undefined1  [8])&local_78;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  local_70 = 2;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  estl::vector_s<unsigned_int,_12UL>::vector_s(&local_58,(initializer_list<unsigned_int> *)local_a8)
  ;
  local_78._M_head_impl = local_78._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"0u","v[0]",(uint *)&local_78,local_58.data_ptr_);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x273,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_78._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"1u","v[1]",(uint *)&local_78,
             (uint *)((long)local_58.data_ptr_ + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x274,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_78._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"2u","v[2]",(uint *)&local_78,
             (uint *)((long)local_58.data_ptr_ + 8));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x275,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_._0_4_ = 3;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"3u","v.size()",(uint *)&local_88,(unsigned_long *)&local_78);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x276,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  estl::vector_s<unsigned_int,12ul>::insert<unsigned_int_const*>
            ((vector_s<unsigned_int,12ul> *)&local_58,local_58.data_ptr_,local_68,local_68);
  local_78._M_head_impl = local_78._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"0u","v[0]",(uint *)&local_78,local_58.data_ptr_);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x27a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_78._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"1u","v[1]",(uint *)&local_78,
             (uint *)((long)local_58.data_ptr_ + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x27b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_78._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"2u","v[2]",(uint *)&local_78,
             (uint *)((long)local_58.data_ptr_ + 8));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x27c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_._0_4_ = 3;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"3u","v.size()",(uint *)&local_88,(unsigned_long *)&local_78);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x27d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  last = local_68 + 3;
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       estl::vector_s<unsigned_int,12ul>::insert<unsigned_int_const*>
                 ((vector_s<unsigned_int,12ul> *)&local_58,local_58.data_ptr_,local_68,last);
  local_88.data_ = (AssertHelperData *)local_58.data_ptr_;
  testing::internal::CmpHelperEQ<unsigned_int*,unsigned_int*>
            ((internal *)local_a8,"v.begin()","it1",(uint **)&local_88,(uint **)&local_78);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x281,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[0]","*it1",local_68,(uint *)local_78._M_head_impl);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x282,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  lhs = local_68 + 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[1]","*(it1 + 1)",lhs,(uint *)(local_78._M_head_impl + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x283,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  lhs_00 = local_68 + 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[2]","*(it1 + 2)",lhs_00,(uint *)(local_78._M_head_impl + 8));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x284,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"10u","v[0]",(uint *)&local_88,local_58.data_ptr_);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x285,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"20u","v[1]",(uint *)&local_88,
             (uint *)((long)local_58.data_ptr_ + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x286,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_._0_4_ = 0x1e;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"30u","v[2]",(uint *)&local_88,
             (uint *)((long)local_58.data_ptr_ + 8));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x287,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_ = local_88.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"0u","v[3]",(uint *)&local_88,
             (uint *)((long)((long)local_58.data_ptr_ + 8) + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x288,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"1u","v[4]",(uint *)&local_88,
             (uint *)((long)local_58.data_ptr_ + 0x10));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x289,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"2u","v[5]",(uint *)&local_88,
             (uint *)((long)local_58.data_ptr_ + 0x14));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x28a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 6;
  local_88.data_ = (AssertHelperData *)local_58.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"6u","v.size()",(uint *)&local_90,(unsigned_long *)&local_88);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x28b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_88.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88.data_ =
       (AssertHelperData *)
       estl::vector_s<unsigned_int,12ul>::insert<unsigned_int_const*>
                 ((vector_s<unsigned_int,12ul> *)&local_58,
                  (const_iterator)((long)((long)local_58.data_ptr_ + 8) + 4),local_68,last);
  local_90.data_ = (AssertHelperData *)((long)((long)local_58.data_ptr_ + 8) + 4);
  testing::internal::CmpHelperEQ<unsigned_int*,unsigned_int*>
            ((internal *)local_a8,"v.begin()+3","it2",(uint **)&local_90,(uint **)&local_88);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x28f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[0]","*it2",local_68,&(local_88.data_)->type);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x290,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[1]","*(it2 + 1)",lhs,(uint *)&(local_88.data_)->field_0x4);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x291,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[2]","*(it2 + 2)",lhs_00,(uint *)&(local_88.data_)->file);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x292,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"10u","v[0]",(uint *)&local_90,local_58.data_ptr_);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x293,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"20u","v[1]",(uint *)&local_90,
             (uint *)((long)local_58.data_ptr_ + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x294,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 0x1e;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"30u","v[2]",(uint *)&local_90,
             (uint *)((long)local_58.data_ptr_ + 8));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x295,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"10u","v[3]",(uint *)&local_90,
             (uint *)((long)((long)local_58.data_ptr_ + 8) + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x296,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"20u","v[4]",(uint *)&local_90,
             (uint *)((long)local_58.data_ptr_ + 0x10));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x297,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 0x1e;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"30u","v[5]",(uint *)&local_90,
             (uint *)((long)local_58.data_ptr_ + 0x14));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x298,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_ = local_90.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"0u","v[6]",(uint *)&local_90,
             (uint *)((long)local_58.data_ptr_ + 0x18));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x299,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"1u","v[7]",(uint *)&local_90,
             (uint *)((long)&(((string *)((long)local_58.data_ptr_ + 0x18))->_M_dataplus)._M_p + 4))
  ;
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x29a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"2u","v[8]",(uint *)&local_90,
             (uint *)&((string *)((long)local_58.data_ptr_ + 0x18))->_M_string_length);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x29b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 9;
  local_90.data_ = (AssertHelperData *)local_58.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"9u","v.size()",(uint *)&local_98,(unsigned_long *)&local_90);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x29c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_90.data_ =
       (AssertHelperData *)
       estl::vector_s<unsigned_int,12ul>::insert<unsigned_int_const*>
                 ((vector_s<unsigned_int,12ul> *)&local_58,local_58.data_ptr_ + local_58.size_,
                  local_68,last);
  local_98.data_ =
       (AssertHelperData *)
       ((long)&((string *)((long)local_58.data_ptr_ + 0x18))->_M_string_length + 4);
  testing::internal::CmpHelperEQ<unsigned_int*,unsigned_int*>
            ((internal *)local_a8,"v.begin()+9","it3",(uint **)&local_98,(uint **)&local_90);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[0]","*it3",local_68,&(local_90.data_)->type);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[1]","*(it3 + 1)",lhs,(uint *)&(local_90.data_)->field_0x4);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"src[2]","*(it3 + 2)",lhs_00,(uint *)&(local_90.data_)->file);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"10u","v[0]",(uint *)&local_98,local_58.data_ptr_);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"20u","v[1]",(uint *)&local_98,
             (uint *)((long)local_58.data_ptr_ + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 0x1e;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"30u","v[2]",(uint *)&local_98,
             (uint *)((long)local_58.data_ptr_ + 8));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"10u","v[3]",(uint *)&local_98,
             (uint *)((long)((long)local_58.data_ptr_ + 8) + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"20u","v[4]",(uint *)&local_98,
             (uint *)((long)local_58.data_ptr_ + 0x10));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a8,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 0x1e;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"30u","v[5]",(uint *)&local_98,
             (uint *)((long)local_58.data_ptr_ + 0x14));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2a9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_ = local_98.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"0u","v[6]",(uint *)&local_98,
             (uint *)((long)local_58.data_ptr_ + 0x18));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2aa,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"1u","v[7]",(uint *)&local_98,
             (uint *)((long)&(((string *)((long)local_58.data_ptr_ + 0x18))->_M_dataplus)._M_p + 4))
  ;
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2ab,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"2u","v[8]",(uint *)&local_98,
             (uint *)&((string *)((long)local_58.data_ptr_ + 0x18))->_M_string_length);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2ac,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"10u","v[9]",(uint *)&local_98,
             (uint *)((long)&((string *)((long)local_58.data_ptr_ + 0x18))->_M_string_length + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2ad,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 0x14;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"20u","v[10]",(uint *)&local_98,
             (uint *)&(((string *)((long)local_58.data_ptr_ + 0x18))->field_2)._M_allocated_capacity
            );
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2ae,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_98.data_._0_4_ = 0x1e;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_a8,"30u","v[11]",(uint *)&local_98,
             (uint *)((((string *)((long)local_58.data_ptr_ + 0x18))->field_2)._M_local_buf + 4));
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2af,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_80.data_._0_4_ = 0xc;
  local_98.data_ = (AssertHelperData *)local_58.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_a8,"12u","v.size()",(uint *)&local_80,(unsigned_long *)&local_98);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x2b0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, insert_iterator_range)
{
    constexpr std::array<unsigned, 3> src{10u,20u,30u};
    vector_s<unsigned, 12> v{0u,1u,2u};
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert zero elements
    v.insert(v.begin(), src.begin(), src.begin());
    EXPECT_EQ(0u, v[0]);
    EXPECT_EQ(1u, v[1]);
    EXPECT_EQ(2u, v[2]);
    EXPECT_EQ(3u, v.size());

    // Insert 3 elements from start
    const auto it1 = v.insert(v.begin(), src.begin(), src.end());
    EXPECT_EQ(v.begin(), it1);
    EXPECT_EQ(src[0], *it1);
    EXPECT_EQ(src[1], *(it1 + 1));
    EXPECT_EQ(src[2], *(it1 + 2));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(20u, v[1]);
    EXPECT_EQ(30u, v[2]);
    EXPECT_EQ(0u, v[3]);
    EXPECT_EQ(1u, v[4]);
    EXPECT_EQ(2u, v[5]);
    EXPECT_EQ(6u, v.size());

    // Insert 3 elements in the middle
    const auto it2 = v.insert(v.begin()+3, src.begin(), src.end());
    EXPECT_EQ(v.begin()+3, it2);
    EXPECT_EQ(src[0], *it2);
    EXPECT_EQ(src[1], *(it2 + 1));
    EXPECT_EQ(src[2], *(it2 + 2));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(20u, v[1]);
    EXPECT_EQ(30u, v[2]);
    EXPECT_EQ(10u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(30u, v[5]);
    EXPECT_EQ(0u, v[6]);
    EXPECT_EQ(1u, v[7]);
    EXPECT_EQ(2u, v[8]);
    EXPECT_EQ(9u, v.size());

    // Insert 3 elements 'in' the end
    const auto it3 = v.insert(v.end(), src.begin(), src.end());
    EXPECT_EQ(v.begin()+9, it3);
    EXPECT_EQ(src[0], *it3);
    EXPECT_EQ(src[1], *(it3 + 1));
    EXPECT_EQ(src[2], *(it3 + 2));
    EXPECT_EQ(10u, v[0]);
    EXPECT_EQ(20u, v[1]);
    EXPECT_EQ(30u, v[2]);
    EXPECT_EQ(10u, v[3]);
    EXPECT_EQ(20u, v[4]);
    EXPECT_EQ(30u, v[5]);
    EXPECT_EQ(0u, v[6]);
    EXPECT_EQ(1u, v[7]);
    EXPECT_EQ(2u, v[8]);
    EXPECT_EQ(10u, v[9]);
    EXPECT_EQ(20u, v[10]);
    EXPECT_EQ(30u, v[11]);
    EXPECT_EQ(12u, v.size());
}